

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O0

string_type * __thiscall
booster::locale::impl_icu::converter_impl<char>::convert_abi_cxx11_
          (converter_impl<char> *this,conversion_type how,char_type *begin,char_type *end,int flags)

{
  undefined4 in_EDX;
  long in_RSI;
  string_type *in_RDI;
  UnicodeString str;
  icu_std_converter<char,_1> cvt;
  Locale local_d0 [4];
  cpcvt_type in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff38;
  icu_std_converter<char,_1> *in_stack_ffffffffffffff40;
  icu_std_converter<char,_1> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  UnicodeString *in_stack_ffffffffffffff70;
  icu_std_converter<char,_1> *in_stack_ffffffffffffff78;
  string local_80 [108];
  undefined4 local_14;
  
  local_14 = in_EDX;
  std::__cxx11::string::string(local_80,(string *)(in_RSI + 0xf0));
  icu_std_converter<char,_1>::icu_std_converter
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::~string(local_80);
  icu_std_converter<char,_1>::icu
            (in_stack_ffffffffffffff78,(char_type *)in_stack_ffffffffffffff70,
             (char_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  switch(local_14) {
  case 0:
    anon_unknown_12::normalize_string(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    break;
  case 1:
    icu_70::UnicodeString::toUpper(local_d0);
    break;
  case 2:
    icu_70::UnicodeString::toLower(local_d0);
    break;
  case 3:
    icu_70::UnicodeString::foldCase((uint)local_d0);
    break;
  case 4:
    icu_70::UnicodeString::toTitle((BreakIterator *)local_d0,(Locale *)0x0);
  }
  icu_std_converter<char,1>::std_abi_cxx11_
            (in_stack_ffffffffffffff48,(UnicodeString *)in_stack_ffffffffffffff40);
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)local_d0);
  icu_std_converter<char,_1>::~icu_std_converter((icu_std_converter<char,_1> *)0x2648d0);
  return in_RDI;
}

Assistant:

virtual string_type convert(converter_base::conversion_type how,char_type const *begin,char_type const *end,int flags = 0) const
        {
            icu_std_converter<char_type> cvt(encoding_);
            icu::UnicodeString str=cvt.icu(begin,end);
            switch(how) {
            case converter_base::normalization:
                normalize_string(str,flags);
                break;
            case converter_base::upper_case:
                str.toUpper(locale_);
                break;
            case converter_base::lower_case:
                str.toLower(locale_);
                break;
            case converter_base::title_case:
                str.toTitle(0,locale_);
                break;
            case converter_base::case_folding:
                str.foldCase();
                break;
            default:
                ;
            }
            return cvt.std(str);
        }